

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  byte bVar8;
  int iVar9;
  GetterXsYs<unsigned_char> *pGVar10;
  TransformerLogLin *pTVar11;
  ImPlotPlot *pIVar12;
  GetterXsYRef<unsigned_char> *pGVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  double dVar16;
  double dVar17;
  ImVec2 IVar18;
  ushort uVar19;
  ImPlotContext *pIVar20;
  ImPlotContext *pIVar21;
  bool bVar22;
  long lVar23;
  ImDrawIdx IVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  ImVec2 IVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  
  pIVar20 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar9 = pGVar10->Count;
  lVar23 = (long)(((pGVar10->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar10->Stride;
  bVar8 = pGVar10->Ys[lVar23];
  dVar16 = log10((double)pGVar10->Xs[lVar23] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar21 = GImPlot;
  pIVar12 = pIVar20->CurrentPlot;
  dVar7 = (pIVar12->XAxis).Range.Min;
  iVar9 = pTVar11->YAxis;
  fVar26 = (float)((((double)(float)(dVar16 / pIVar20->LogDenX) *
                     ((pIVar12->XAxis).Range.Max - dVar7) + dVar7) - dVar7) * pIVar20->Mx +
                  (double)pIVar20->PixelRange[iVar9].Min.x);
  fVar27 = (float)(((double)bVar8 - pIVar12->YAxis[iVar9].Range.Min) * pIVar20->My[iVar9] +
                  (double)pIVar20->PixelRange[iVar9].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  iVar9 = pGVar13->Count;
  dVar7 = pGVar13->YRef;
  dVar17 = log10((double)pGVar13->Xs
                         [(long)(((prim + 1 + pGVar13->Offset) % iVar9 + iVar9) % iVar9) *
                          (long)pGVar13->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar12 = pIVar21->CurrentPlot;
  dVar16 = (pIVar12->XAxis).Range.Min;
  iVar9 = pTVar11->YAxis;
  fVar31 = (float)((((double)(float)(dVar17 / pIVar21->LogDenX) *
                     ((pIVar12->XAxis).Range.Max - dVar16) + dVar16) - dVar16) * pIVar21->Mx +
                  (double)pIVar21->PixelRange[iVar9].Min.x);
  fVar33 = (float)((dVar7 - pIVar12->YAxis[iVar9].Range.Min) * pIVar21->My[iVar9] +
                  (double)pIVar21->PixelRange[iVar9].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar29 = fVar3;
  if (fVar5 <= fVar3) {
    fVar29 = fVar5;
  }
  if (fVar27 <= fVar29) {
    fVar29 = fVar27;
  }
  if (fVar33 <= fVar29) {
    fVar29 = fVar33;
  }
  bVar22 = false;
  if ((fVar29 < (cull_rect->Max).y) &&
     (fVar29 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar25 = -(uint)(fVar27 <= fVar29),
     fVar29 = (float)(~uVar25 & (uint)fVar27 | uVar25 & (uint)fVar29),
     uVar25 = -(uint)(fVar33 <= fVar29),
     fVar29 = (float)(~uVar25 & (uint)fVar33 | uVar25 & (uint)fVar29), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar29 && fVar29 != *pfVar1)) {
    fVar29 = fVar2;
    if (fVar4 <= fVar2) {
      fVar29 = fVar4;
    }
    if (fVar26 <= fVar29) {
      fVar29 = fVar26;
    }
    if (fVar31 <= fVar29) {
      fVar29 = fVar31;
    }
    bVar22 = false;
    if (fVar29 < (cull_rect->Max).x) {
      fVar29 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar25 = -(uint)(fVar26 <= fVar29);
      fVar29 = (float)(~uVar25 & (uint)fVar26 | uVar25 & (uint)fVar29);
      uVar25 = -(uint)(fVar31 <= fVar29);
      fVar29 = (float)(~uVar25 & (uint)fVar31 | uVar25 & (uint)fVar29);
      bVar22 = (cull_rect->Min).x <= fVar29 && fVar29 != (cull_rect->Min).x;
    }
  }
  IVar28.y = fVar27;
  IVar28.x = fVar26;
  IVar30.y = fVar33;
  IVar30.x = fVar31;
  if (bVar22 != false) {
    fVar29 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar35 = fVar2 * fVar27 - fVar26 * fVar3;
    fVar34 = fVar4 * fVar33 - fVar31 * fVar5;
    fVar32 = (fVar2 - fVar26) * (fVar5 - fVar33) - (fVar4 - fVar31) * (fVar3 - fVar27);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = this->Col;
    pIVar14[1].pos = IVar28;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = this->Col;
    IVar18.y = ((fVar5 - fVar33) * fVar35 - (fVar3 - fVar27) * fVar34) / fVar32;
    IVar18.x = (fVar35 * (fVar4 - fVar31) - (fVar2 - fVar26) * fVar34) / fVar32;
    pIVar14[2].pos = IVar18;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = this->Col;
    pIVar14[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = this->Col;
    pIVar14[4].pos = IVar30;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar14 + 5;
    uVar25 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar24 = (ImDrawIdx)uVar25;
    *pIVar15 = IVar24;
    uVar19 = -(ushort)(fVar6 < fVar29 && fVar27 < fVar33 || fVar29 < fVar6 && fVar33 < fVar27) & 1;
    pIVar15[1] = IVar24 + uVar19 + 1;
    pIVar15[2] = IVar24 + 3;
    pIVar15[3] = IVar24 + 1;
    pIVar15[4] = (uVar19 ^ 3) + IVar24;
    pIVar15[5] = IVar24 + 4;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar25 + 5;
  }
  this->P11 = IVar28;
  this->P12 = IVar30;
  return bVar22;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }